

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStream.h
# Opt level: O3

void __thiscall
cmBasicUVIStream<char,_std::char_traits<char>_>::cmBasicUVIStream
          (cmBasicUVIStream<char,_std::char_traits<char>_> *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream = pp_Var1;
  *(void **)((long)&(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream +
            (long)pp_Var1[-3]) = vtt[3];
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream = pp_Var1;
  *(void **)((long)&(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream +
            (long)pp_Var1[-3]) = vtt[2];
  (this->super_basic_istream<char,_std::char_traits<char>_>)._M_gcount = 0;
  std::ios::init((streambuf *)
                 ((long)&(this->super_basic_istream<char,_std::char_traits<char>_>).
                         _vptr_basic_istream +
                 (long)(this->super_basic_istream<char,_std::char_traits<char>_>).
                       _vptr_basic_istream[-3]));
  pp_Var1 = (_func_int **)*vtt;
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream = pp_Var1;
  *(void **)((long)&(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream +
            (long)pp_Var1[-3]) = vtt[3];
  cmBasicUVStreambuf<char,_std::char_traits<char>_>::cmBasicUVStreambuf
            ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)
             &(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10,0x100,8);
  return;
}

Assistant:

cmBasicUVIStream<CharT, Traits>::cmBasicUVIStream()
  : std::basic_istream<CharT, Traits>(&this->Buffer)
{
}